

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void ScanPair(ConfigScanner *sc)

{
  _Bool _Var1;
  
  if (sc != (ConfigScanner *)0x0) {
    SkipSpace(sc);
    _Var1 = GetKeyWord(sc);
    if (_Var1) {
      SkipSpace(sc);
      if (*sc->ptr == '=') {
        sc->ptr = sc->ptr + 1;
        SkipSpace(sc);
        ScanValue(sc);
        return;
      }
    }
  }
  return;
}

Assistant:

void ScanPair(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	SkipSpace(sc);
	if (!GetKeyWord(sc))
	{
		return;
	}
	SkipSpace(sc);
	if (!GetEQ(sc))
	{
		return;
	}
	SkipSpace(sc);
	if (!ScanValue(sc))
	{
		return;
	}
	return;
}